

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::SubRegRegCommand::GetIn
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          SubRegRegCommand *this)

{
  long lVar1;
  initializer_list<IRT::CTemp> __l;
  allocator_type local_51;
  CTemp local_50;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)&local_50,(string *)&this->leftOperand);
  std::__cxx11::string::string(local_30,(string *)&this->rightOperand);
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,&local_51)
  ;
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50.name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::SubRegRegCommand::GetIn( ) const {
    return { leftOperand, rightOperand };
}